

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_rex_checkfn(arg_rex *parent)

{
  return (int)(parent->count < (parent->hdr).mincount);
}

Assistant:

static int arg_rex_checkfn(struct arg_rex * parent) {
	int errorcode = (parent->count < parent->hdr.mincount) ? EMINCOUNT : 0;
	//struct privhdr *priv = (struct privhdr*)parent->hdr.priv;

	/* free the regex "program" we constructed in resetfn */
	//regfree(&(priv->regex));

	/*printf("%s:checkfn(%p) returns %d\n",__FILE__,parent,errorcode);*/
	return errorcode;
}